

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmFPU_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmFDbcc<(moira::Instr)190,(moira::Mode)12,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  bool bVar2;
  u32 uVar3;
  i32 iVar4;
  StrWriter *pSVar5;
  UInt local_4c [2];
  Dn local_44;
  int local_40;
  Fcc local_3c [2];
  u32 local_34;
  byte local_2e;
  byte local_2d;
  u32 dst;
  u8 cnd;
  u32 uStack_28;
  u8 src;
  u32 ext;
  u32 old;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  uStack_28 = *addr;
  ext._2_2_ = op;
  _old = addr;
  addr_local = (u32 *)str;
  str_local = (StrWriter *)this;
  dst = dasmIncRead<2>(this,addr);
  local_2d = (byte)ext._2_2_ & 7;
  local_2e = (byte)dst & 0x1f;
  if (((**(int **)(addr_local + 0xc) != 2) && (**(int **)(addr_local + 0xc) != 3)) ||
     (bVar2 = isValidExtFPU(this,FDBcc,IP,ext._2_2_,dst), bVar2)) {
    uVar1 = *_old;
    local_34 = uVar1 + 2;
    uVar3 = dasmIncRead<2>(this,_old);
    iVar4 = SEXT<2>((ulong)uVar3);
    local_34 = uVar1 + 2 + iVar4;
    pSVar5 = StrWriter::operator<<((StrWriter *)addr_local);
    Fcc::Fcc(local_3c,(uint)local_2e);
    pSVar5 = StrWriter::operator<<(pSVar5,local_3c[0]);
    local_40 = addr_local[0xe];
    pSVar5 = StrWriter::operator<<(pSVar5,(Tab)local_40);
    Dn::Dn(&local_44,(uint)local_2d);
    pSVar5 = StrWriter::operator<<(pSVar5,local_44);
    pSVar5 = StrWriter::operator<<(pSVar5);
    UInt::UInt(local_4c,local_34);
    StrWriter::operator<<(pSVar5,local_4c[0]);
  }
  else {
    *_old = uStack_28;
    dasmIllegal<(moira::Instr)190,(moira::Mode)12,2>(this,(StrWriter *)addr_local,_old,ext._2_2_);
  }
  return;
}

Assistant:

void
Moira::dasmFDbcc(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead(addr);
    auto src = _____________xxx (op);
    auto cnd = ___________xxxxx (ext);

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExtFPU(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    auto dst = addr + 2;
    U32_INC(dst, SEXT<S>(dasmIncRead<S>(addr)));

    str << Ins<I>{} << Fcc{cnd} << str.tab << Dn{src} << Sep{} << UInt(dst);
}